

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayout::saveState(QDockAreaLayout *this,QDataStream *stream)

{
  long lVar1;
  QDataStream *pQVar2;
  QRect *pQVar3;
  int iVar4;
  int i;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator<<(stream);
  lVar1 = 0;
  iVar4 = 0;
  do {
    iVar4 = (iVar4 + 1) - (uint)(*(long *)((long)&this->docks[0].item_list.d.size + lVar1) == 0);
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x1c0);
  QDataStream::operator<<(stream,iVar4);
  pQVar3 = &this->docks[0].rect;
  lVar1 = 0;
  do {
    if (*(qsizetype *)((long)(pQVar3 + 2) + 8) != 0) {
      pQVar2 = (QDataStream *)QDataStream::operator<<(stream,(int)lVar1);
      local_40.wd.m_i = ((pQVar3->x2).m_i - (pQVar3->x1).m_i) + 1;
      local_40.ht.m_i = ((pQVar3->y2).m_i - (pQVar3->y1).m_i) + 1;
      ::operator<<(pQVar2,&local_40);
      QDockAreaLayoutInfo::saveState((QDockAreaLayoutInfo *)((long)(pQVar3 + -3) + 8),stream);
    }
    lVar1 = lVar1 + 1;
    pQVar3 = pQVar3 + 7;
  } while (lVar1 != 4);
  local_40.wd.m_i = ((this->centralWidgetRect).x2.m_i - (this->centralWidgetRect).x1.m_i) + 1;
  local_40.ht.m_i = ((this->centralWidgetRect).y2.m_i - (this->centralWidgetRect).y1.m_i) + 1;
  ::operator<<(stream,&local_40);
  lVar1 = 0;
  do {
    QDataStream::operator<<(stream,this->corners[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::saveState(QDataStream &stream) const
{
    stream << (uchar) DockWidgetStateMarker;
    int cnt = 0;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        if (!docks[i].item_list.isEmpty())
            ++cnt;
    }
    stream << cnt;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        if (docks[i].item_list.isEmpty())
            continue;
        stream << i << docks[i].rect.size();
        docks[i].saveState(stream);
    }

    stream << centralWidgetRect.size();

    for (int i = 0; i < 4; ++i)
        stream << static_cast<int>(corners[i]);
}